

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dot.h
# Opt level: O2

RealScalar __thiscall
Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::norm
          (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this)

{
  RealScalar RVar1;
  
  RVar1 = squaredNorm(this);
  return SQRT(RVar1);
}

Assistant:

EIGEN_STRONG_INLINE typename NumTraits<typename internal::traits<Derived>::Scalar>::Real MatrixBase<Derived>::norm() const
{
  return numext::sqrt(squaredNorm());
}